

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int bgzf_read_block(BGZF *fp)

{
  uint64_t *puVar1;
  uint uVar2;
  uint *puVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  off_t oVar7;
  size_t sVar8;
  z_stream *pzVar9;
  byte bVar10;
  int iVar11;
  off_t offset;
  char *__src;
  uint uVar12;
  undefined8 *puVar13;
  uint uVar14;
  int iVar15;
  char *pcVar16;
  ulong uVar17;
  int *piVar18;
  hFILE *phVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  uint8_t header [18];
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  undefined4 uStack_64;
  undefined2 uStack_60;
  short sStack_5e;
  char cStack_5c;
  char cStack_5b;
  short sStack_5a;
  ushort local_58;
  hFILE *local_48;
  ulong local_40;
  ulong local_38;
  
  phVar19 = fp->fp;
  if ((*(uint *)fp & 0x60000000) == 0) {
    pvVar4 = fp->uncompressed_block;
    uVar17 = (long)phVar19->end - (long)phVar19->begin;
    sVar8 = 0x10000;
    if (uVar17 < 0x10000) {
      sVar8 = uVar17;
    }
    memcpy(pvVar4,phVar19->begin,sVar8);
    phVar19->begin = phVar19->begin + sVar8;
    if (uVar17 < 0x10000) {
      sVar8 = hread2(phVar19,pvVar4,0x10000,sVar8);
    }
    iVar15 = (int)sVar8;
    if (iVar15 != 0) {
      if (fp->block_length != 0) {
        fp->block_offset = 0;
      }
      fp->block_address = fp->block_address + (long)iVar15;
      fp->block_length = iVar15;
      return 0;
    }
LAB_0013c25c:
    fp->block_length = 0;
    return 0;
  }
  __src = phVar19->begin;
  pcVar16 = __src + (phVar19->offset - (long)phVar19->buffer);
  if (((int)*(uint *)fp < 0) && (fp->gz_stream != (z_stream *)0x0)) {
    iVar15 = inflate_gzip_block(fp,0);
    if (-1 < iVar15) {
      fp->block_length = iVar15;
      fp->block_address = (int64_t)pcVar16;
      return 0;
    }
    goto LAB_0013c3a9;
  }
  if (fp->cache_size != 0) {
    puVar3 = (uint *)fp->cache;
    uVar6 = *puVar3;
    if (uVar6 == 0) {
      uVar12 = 0;
LAB_0013c070:
      if (uVar12 != uVar6) {
        piVar18 = (int *)((ulong)uVar12 * 0x18 + *(long *)(puVar3 + 8));
        if (fp->block_length != 0) {
          fp->block_offset = 0;
        }
        fp->block_address = (int64_t)pcVar16;
        fp->block_length = *piVar18;
        memcpy(fp->uncompressed_block,*(void **)(piVar18 + 2),0x10000);
        offset = *(off_t *)(piVar18 + 4);
        oVar7 = hseek(fp->fp,offset,0);
        iVar15 = (int)offset;
        if (oVar7 < 0) {
          piVar18 = piVar18 + 4;
          bgzf_read_block_cold_1();
          puVar13 = *(undefined8 **)(piVar18 + 0x16);
          if (iVar15 != 0) goto LAB_0013c493;
          bVar22 = *(int *)(puVar13 + 4) == 0;
          do {
            if (!bVar22) {
              pvVar4 = *(void **)(piVar18 + 10);
              phVar19 = *(hFILE **)(piVar18 + 0xe);
              uVar17 = (long)phVar19->end - (long)phVar19->begin;
              sVar8 = 0xff00;
              if (uVar17 < 0xff00) {
                sVar8 = uVar17;
              }
              memcpy(pvVar4,phVar19->begin,sVar8);
              phVar19->begin = phVar19->begin + sVar8;
              if (uVar17 < 0xff00) {
                sVar8 = hread2(phVar19,pvVar4,0xff00,sVar8);
              }
              puVar13 = *(undefined8 **)(piVar18 + 0x16);
              *(int *)(puVar13 + 1) = (int)sVar8;
              if ((int)sVar8 == 0) {
                return 0;
              }
              *puVar13 = *(undefined8 *)(piVar18 + 10);
            }
LAB_0013c493:
            do {
              iVar15 = piVar18[3];
              puVar13[3] = (long)iVar15 + *(long *)(piVar18 + 8);
              *(int *)(puVar13 + 4) = 0x10000 - iVar15;
              iVar15 = inflate(puVar13,0);
              if (iVar15 != -5) {
                if (iVar15 < 0) {
                  return -1;
                }
                puVar13 = *(undefined8 **)(piVar18 + 0x16);
                iVar11 = 0;
                if (*(int *)(puVar13 + 4) != 0x10000) {
                  return 0x10000 - *(int *)(puVar13 + 4);
                }
                goto LAB_0013c4de;
              }
              puVar13 = *(undefined8 **)(piVar18 + 0x16);
            } while (*(int *)(puVar13 + 4) == 0);
            iVar11 = 0x10000 - *(int *)(puVar13 + 4);
LAB_0013c4de:
            bVar22 = false;
            if (iVar15 == 1) {
              return iVar11;
            }
          } while( true );
        }
        if (*piVar18 != 0) {
          return 0;
        }
        phVar19 = fp->fp;
        __src = phVar19->begin;
      }
    }
    else {
      uVar14 = ((uint)((ulong)pcVar16 >> 0x21) ^ (uint)pcVar16 << 0xb ^ (uint)pcVar16) & uVar6 - 1;
      iVar15 = 1;
      uVar12 = uVar14;
      do {
        uVar2 = *(uint *)(*(long *)(puVar3 + 4) + (ulong)(uVar12 >> 4) * 4);
        bVar10 = (char)uVar12 * '\x02' & 0x1e;
        uVar21 = uVar2 >> bVar10;
        if (((uVar21 & 2) != 0) ||
           (((uVar21 & 1) == 0 && (*(char **)(*(long *)(puVar3 + 6) + (ulong)uVar12 * 8) == pcVar16)
            ))) {
          if ((uVar2 >> bVar10 & 3) != 0) {
            uVar12 = uVar6;
          }
          goto LAB_0013c070;
        }
        uVar12 = uVar12 + iVar15 & uVar6 - 1;
        iVar15 = iVar15 + 1;
      } while (uVar12 != uVar14);
    }
  }
  uVar17 = (long)phVar19->end - (long)__src;
  sVar8 = 0x12;
  if (uVar17 < 0x12) {
    sVar8 = uVar17;
  }
  memcpy(&local_68,__src,sVar8);
  phVar19->begin = phVar19->begin + sVar8;
  if (uVar17 < 0x12) {
    sVar8 = hread2(phVar19,&local_68,0x12,sVar8);
  }
  if ((int)sVar8 == 0) goto LAB_0013c25c;
  if (((((int)sVar8 != 0x12) || (local_68 != '\x1f')) || (cStack_67 != -0x75)) ||
     (cStack_66 != '\b')) goto LAB_0013c36a;
  if ((((bStack_65 & 4) != 0) && (sStack_5e == 6)) &&
     ((cStack_5c == 'B' && ((cStack_5b == 'C' && (sStack_5a == 2)))))) {
    local_40 = (ulong)local_58;
    puVar13 = (undefined8 *)fp->compressed_block;
    *(ushort *)(puVar13 + 2) = local_58;
    *puVar13 = CONCAT44(uStack_64,CONCAT13(bStack_65,0x88b1f));
    puVar13[1] = CONCAT26(2,CONCAT15(0x43,CONCAT14(0x42,CONCAT22(6,uStack_60))));
    local_38 = local_40 - 0x11;
    local_48 = fp->fp;
    uVar20 = (long)local_48->end - (long)local_48->begin;
    uVar17 = local_38;
    if (uVar20 < local_38) {
      uVar17 = uVar20;
    }
    memcpy((void *)((long)puVar13 + 0x12),local_48->begin,uVar17);
    uVar5 = local_38;
    local_48->begin = local_48->begin + uVar17;
    if (uVar20 < local_38) {
      uVar17 = hread2(local_48,(void *)((long)puVar13 + 0x12),local_38,uVar17);
    }
    if ((int)uVar5 == (int)uVar17) {
      uVar6 = inflate_block(fp,(int)local_40 + 1);
      if ((int)uVar6 < 0) {
        return -1;
      }
      if (fp->block_length != 0) {
        fp->block_offset = 0;
      }
      fp->block_address = (int64_t)pcVar16;
      fp->block_length = uVar6;
      if (fp->idx_build_otf != 0) {
        bgzf_index_add_block(fp);
        puVar1 = &fp->idx->ublock_addr;
        *puVar1 = *puVar1 + (ulong)uVar6;
      }
      cache_block(fp,(int)uVar5 + 0x12);
      return 0;
    }
    *(byte *)fp = *(byte *)fp | 4;
    return -1;
  }
  puVar13 = (undefined8 *)fp->compressed_block;
  *(ushort *)(puVar13 + 2) = local_58;
  *puVar13 = CONCAT44(uStack_64,CONCAT13(bStack_65,0x88b1f));
  puVar13[1] = CONCAT26(sStack_5a,
                        CONCAT15(cStack_5b,CONCAT14(cStack_5c,CONCAT22(sStack_5e,uStack_60))));
  phVar19 = fp->fp;
  local_48 = (hFILE *)((long)puVar13 + 0x12);
  uVar17 = (long)phVar19->end - (long)phVar19->begin;
  sVar8 = 0xfeee;
  if (uVar17 < 0xfeee) {
    sVar8 = uVar17;
  }
  memcpy(local_48,phVar19->begin,sVar8);
  phVar19->begin = phVar19->begin + sVar8;
  if (uVar17 < 0xfeee) {
    sVar8 = hread2(phVar19,local_48,0xfeee,sVar8);
  }
  if ((bStack_65 & 4) == 0) {
    uVar6 = 10;
    if ((bStack_65 & 8) != 0) {
LAB_0013c30f:
      uVar17 = (ulong)uVar6;
      do {
        if (*(char *)((long)puVar13 + uVar17) == '\0') goto LAB_0013c336;
        uVar17 = uVar17 + 1;
      } while (uVar17 != 0xff00);
      goto LAB_0013c36a;
    }
    uVar6 = 10;
    if ((bStack_65 & 0x10) != 0) goto LAB_0013c348;
  }
  else {
    uVar6 = *(ushort *)((long)puVar13 + 10) + 0xc;
    uVar17 = (ulong)uVar6;
    if ((bStack_65 & 8) != 0) {
      if (*(ushort *)((long)puVar13 + 10) < 0xfef4) goto LAB_0013c30f;
      if (uVar6 == 0xff00) goto LAB_0013c36a;
LAB_0013c336:
      uVar17 = (ulong)((int)uVar17 + 1);
    }
    uVar6 = (uint)uVar17;
    if ((bStack_65 & 0x10) != 0) {
      if ((int)uVar6 < 0xff00) {
LAB_0013c348:
        uVar17 = (ulong)uVar6;
        do {
          if (*(char *)((long)puVar13 + uVar17) == '\0') goto LAB_0013c36f;
          uVar17 = uVar17 + 1;
        } while (uVar17 != 0xff00);
LAB_0013c36a:
        *(byte *)fp = *(byte *)fp | 2;
        return -1;
      }
      if (uVar6 == 0xff00) goto LAB_0013c36a;
LAB_0013c36f:
      uVar6 = (int)uVar17 + 1;
    }
  }
  fp->field_0x3 = fp->field_0x3 | 0x80;
  pzVar9 = (z_stream *)calloc(1,0x70);
  fp->gz_stream = pzVar9;
  iVar15 = inflateInit2_(pzVar9,0xfffffff1,"1.2.11",0x70);
  if (iVar15 == 0) {
    iVar15 = uVar6 + (bStack_65 & 2);
    pzVar9 = fp->gz_stream;
    pzVar9->avail_in = ((int)sVar8 + 0x12) - iVar15;
    pzVar9->next_in = (Bytef *)((long)puVar13 + (long)iVar15);
    iVar15 = inflate_gzip_block(fp,1);
    if (-1 < iVar15) {
      fp->block_length = iVar15;
      fp->block_address = (int64_t)pcVar16;
      return -(uint)(fp->idx_build_otf != 0);
    }
  }
LAB_0013c3a9:
  *(byte *)fp = *(byte *)fp | 1;
  return -1;
}

Assistant:

int bgzf_read_block(BGZF *fp)
{
    uint8_t header[BLOCK_HEADER_LENGTH], *compressed_block;
    int count, size = 0, block_length, remaining;

    // Reading an uncompressed file
    if ( !fp->is_compressed )
    {
        count = hread(fp->fp, fp->uncompressed_block, BGZF_MAX_BLOCK_SIZE);
        if ( count==0 )
        {
            fp->block_length = 0;
            return 0;
        }
        if (fp->block_length != 0) fp->block_offset = 0;
        fp->block_address += count;
        fp->block_length = count;
        return 0;
    }

    // Reading compressed file
    int64_t block_address;
    block_address = htell(fp->fp);
    if ( fp->is_gzip && fp->gz_stream ) // is this is a initialized gzip stream?
    {
        count = inflate_gzip_block(fp, 0);
        if ( count<0 )
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->block_length = count;
        fp->block_address = block_address;
        return 0;
    }
    if (fp->cache_size && load_block_from_cache(fp, block_address)) return 0;
    count = hread(fp->fp, header, sizeof(header));
    if (count == 0) { // no data read
        fp->block_length = 0;
        return 0;
    }
    int ret;
    if ( count != sizeof(header) || (ret=check_header(header))==-2 )
    {
        fp->errcode |= BGZF_ERR_HEADER;
        return -1;
    }
    if ( ret==-1 )
    {
        // GZIP, not BGZF
        uint8_t *cblock = (uint8_t*)fp->compressed_block;
        memcpy(cblock, header, sizeof(header));
        count = hread(fp->fp, cblock+sizeof(header), BGZF_BLOCK_SIZE - sizeof(header)) + sizeof(header);
        int nskip = 10;

        // Check optional fields to skip: FLG.FNAME,FLG.FCOMMENT,FLG.FHCRC,FLG.FEXTRA
        // Note: Some of these fields are untested, I did not have appropriate data available
        if ( header[3] & 0x4 ) // FLG.FEXTRA
        {
            nskip += unpackInt16(&cblock[nskip]) + 2;
        }
        if ( header[3] & 0x8 ) // FLG.FNAME
        {
            while ( nskip<BGZF_BLOCK_SIZE && cblock[nskip] ) nskip++;
            if ( nskip==BGZF_BLOCK_SIZE )
            {
                fp->errcode |= BGZF_ERR_HEADER;
                return -1;
            }
            nskip++;
        }
        if ( header[3] & 0x10 ) // FLG.FCOMMENT
        {
            while ( nskip<BGZF_BLOCK_SIZE && cblock[nskip] ) nskip++;
            if ( nskip==BGZF_BLOCK_SIZE )
            {
                fp->errcode |= BGZF_ERR_HEADER;
                return -1;
            }
            nskip++;
        }
        if ( header[3] & 0x2 ) nskip += 2;  //  FLG.FHCRC

        fp->is_gzip = 1;
        fp->gz_stream = (z_stream*) calloc(1,sizeof(z_stream));
        int ret = inflateInit2(fp->gz_stream, -15);
        if (ret != Z_OK)
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->gz_stream->avail_in = count - nskip;
        fp->gz_stream->next_in  = cblock + nskip;
        count = inflate_gzip_block(fp, 1);
        if ( count<0 )
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->block_length = count;
        fp->block_address = block_address;
        if ( fp->idx_build_otf ) return -1; // cannot build index for gzip
        return 0;
    }
    size = count;
    block_length = unpackInt16((uint8_t*)&header[16]) + 1; // +1 because when writing this number, we used "-1"
    compressed_block = (uint8_t*)fp->compressed_block;
    memcpy(compressed_block, header, BLOCK_HEADER_LENGTH);
    remaining = block_length - BLOCK_HEADER_LENGTH;
    count = hread(fp->fp, &compressed_block[BLOCK_HEADER_LENGTH], remaining);
    if (count != remaining) {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }
    size += count;
    if ((count = inflate_block(fp, block_length)) < 0) return -1;
    if (fp->block_length != 0) fp->block_offset = 0; // Do not reset offset if this read follows a seek.
    fp->block_address = block_address;
    fp->block_length = count;
    if ( fp->idx_build_otf )
    {
        bgzf_index_add_block(fp);
        fp->idx->ublock_addr += count;
    }
    cache_block(fp, size);
    return 0;
}